

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O0

bool __thiscall
iDynTree::BerdyHelper::getBerdyMatrices
          (BerdyHelper *this,SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *D,VectorDynSize *bD,
          SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *Y,VectorDynSize *bY)

{
  int iVar1;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  bool res;
  VectorDynSize *in_stack_00000750;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *in_stack_00000758;
  BerdyHelper *in_stack_00000760;
  VectorDynSize *in_stack_000008b8;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *in_stack_000008c0;
  BerdyHelper *in_stack_000008c8;
  VectorDynSize *in_stack_00000c10;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *in_stack_00000c18;
  BerdyHelper *in_stack_00000c20;
  bool local_47;
  bool local_31;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x1a9) & 1) == 0) {
    iDynTree::reportError("BerdyHelpers","getBerdyMatrices","Kinematic information not set.");
    local_1 = false;
  }
  else {
    local_31 = true;
    iVar1 = *(int *)(in_RDI + 0x1b0);
    if (iVar1 == 0) {
      local_31 = computeBerdyDynamicsMatricesFixedBase
                           (in_stack_00000c20,in_stack_00000c18,in_stack_00000c10);
    }
    else if (iVar1 == 1) {
      local_31 = computeBerdyDynamicsMatricesFloatingBase
                           (in_stack_00000760,in_stack_00000758,in_stack_00000750);
    }
    else if (iVar1 == 2) {
      iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::resize
                (in_RSI,*(ulong *)(in_RDI + 0x200));
      iDynTree::VectorDynSize::resize(in_RDX);
      iDynTree::Triplets::clear();
      iDynTree::VectorDynSize::zero();
    }
    else {
      iDynTree::reportError("BerdyHelpers","getBerdyMatrices","unknown berdy variant");
      local_31 = false;
    }
    local_47 = false;
    if (local_31 != false) {
      local_47 = computeBerdySensorMatrices(in_stack_000008c8,in_stack_000008c0,in_stack_000008b8);
    }
    local_1 = local_47;
  }
  return local_1;
}

Assistant:

bool BerdyHelper::getBerdyMatrices(SparseMatrix<iDynTree::ColumnMajor>& D, VectorDynSize& bD,
                                   SparseMatrix<iDynTree::ColumnMajor>& Y, VectorDynSize& bY)
{
    if (!m_kinematicsUpdated)
    {
        reportError("BerdyHelpers","getBerdyMatrices",
                    "Kinematic information not set.");
        return false;
    }


    bool res = true;

    // Compute D matrix of dynamics equations
    switch(m_options.berdyVariant)
    {
    case ORIGINAL_BERDY_FIXED_BASE:
        res = res && computeBerdyDynamicsMatricesFixedBase(D, bD);
        break;
    case BERDY_FLOATING_BASE:
        res = res && computeBerdyDynamicsMatricesFloatingBase(D, bD);
        break;
    case BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES:
        // D and bD are not used with this variant
        D.resize(m_nrOfDynamicEquations,m_nrOfDynamicalVariables);
        bD.resize(m_nrOfDynamicEquations);
        matrixDElements.clear();
        bD.zero();
        break;
    default:
        reportError("BerdyHelpers", "getBerdyMatrices", "unknown berdy variant");
        res = false;
    }

    // Compute Y matrix of sensors
    res = res && computeBerdySensorMatrices(Y, bY);

    return res;
}